

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::cpp::PrimitiveTypeName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Options *options,CppType type)

{
  char *pcVar1;
  char *pcVar2;
  AlphaNum local_98;
  undefined8 local_68;
  char *local_60;
  AlphaNum local_38;
  
  switch((int)options) {
  case 1:
    local_38.piece_._M_len = 5;
    local_38.piece_._M_str = "int32";
    goto LAB_001e5902;
  case 2:
    local_38.piece_._M_len = 5;
    local_38.piece_._M_str = "int64";
    goto LAB_001e5902;
  case 3:
    local_38.piece_._M_len = 6;
    local_38.piece_._M_str = "uint32";
    goto LAB_001e5902;
  case 4:
    local_38.piece_._M_len = 6;
    local_38.piece_._M_str = "uint64";
LAB_001e5902:
    local_98.piece_._M_str = "::";
    local_98.piece_._M_len = 2;
    local_68 = 2;
    local_60 = "_t";
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_98,&local_38);
    return __return_storage_ptr__;
  case 5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "double";
    pcVar1 = "";
    break;
  case 6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "float";
    pcVar1 = "";
    break;
  case 7:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "bool";
    pcVar1 = "";
    break;
  case 8:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "int";
    pcVar1 = "";
    break;
  case 9:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "std::string";
    pcVar1 = "";
    break;
  case 10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = "";
    pcVar2 = "";
    break;
  default:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/compiler/cpp/helpers.cc"
               ,0x2e0);
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)&local_98,(char (*) [16])"Can\'t get here.");
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_98);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string PrimitiveTypeName(const Options& options,
                              FieldDescriptor::CppType type) {
  switch (type) {
    case FieldDescriptor::CPPTYPE_INT32:
      return IntTypeName(options, "int32");
    case FieldDescriptor::CPPTYPE_INT64:
      return IntTypeName(options, "int64");
    case FieldDescriptor::CPPTYPE_UINT32:
      return IntTypeName(options, "uint32");
    case FieldDescriptor::CPPTYPE_UINT64:
      return IntTypeName(options, "uint64");
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return "double";
    case FieldDescriptor::CPPTYPE_FLOAT:
      return "float";
    case FieldDescriptor::CPPTYPE_BOOL:
      return "bool";
    case FieldDescriptor::CPPTYPE_ENUM:
      return "int";
    case FieldDescriptor::CPPTYPE_STRING:
      return "std::string";
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "";

      // No default because we want the compiler to complain if any new
      // CppTypes are added.
  }

  ABSL_LOG(FATAL) << "Can't get here.";
  return "";
}